

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderFields(SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  char *pcVar2;
  char *local_1208;
  bool local_1139;
  string local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  allocator<char> local_1019;
  string local_1018;
  allocator<char> local_ff1;
  string local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  string local_f90;
  string local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  byte local_eea;
  allocator<char> local_ee9;
  string local_ee8;
  allocator<char> local_ec1;
  string local_ec0;
  string local_ea0;
  allocator<char> local_e79;
  string local_e78;
  string local_e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e38;
  undefined1 local_e18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> default_string;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  allocator<char> local_ce9;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  string local_b20;
  string local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  string local_a70;
  allocator<char> local_a49;
  string local_a48;
  string local_a28;
  string local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  string local_958;
  string local_938;
  allocator<char> local_911;
  string local_910;
  byte local_8ea;
  allocator<char> local_8e9;
  undefined1 local_8e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required_reader;
  undefined1 local_8c0 [8];
  string is_required;
  allocator<char> local_879;
  string local_878;
  string local_858;
  allocator<char> local_831;
  string local_830;
  string local_810;
  string local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  string local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  byte local_662;
  allocator<char> local_661;
  undefined1 local_660 [8];
  string default_value_1;
  allocator<char> local_619;
  string local_618;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  string local_588;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  byte local_42a;
  allocator<char> local_429;
  undefined1 local_428 [8];
  string default_value;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> const_string;
  undefined1 local_220 [8];
  string optional;
  undefined1 local_1f8 [8];
  string def_Val;
  undefined1 local_1d0 [7];
  bool opt_scalar;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string type;
  undefined1 local_58 [8];
  string field_field;
  string offset;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  NumToString<unsigned_short>((string *)((long)&field_field.field_2 + 8),(field->value).offset);
  IdlNamer::Field_abi_cxx11_((string *)local_58,&this->namer_,field);
  GenType_abi_cxx11_((string *)local_88,this,&(field->value).type,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"FIELDVAR",&local_a9);
  IdlNamer::Variable_abi_cxx11_(&local_d0,&this->namer_,field);
  CodeWriter::SetValue(&this->code_,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"FIELDMETHOD",&local_f1);
  Namer::Method<flatbuffers::FieldDef>(&local_118,&(this->namer_).super_Namer,field);
  CodeWriter::SetValue(&this->code_,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"VALUETYPE",&local_139);
  CodeWriter::SetValue(&this->code_,&local_138,(string *)local_88);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"OFFSET",&local_161);
  Namer::Constant(&local_188,&(this->namer_).super_Namer,(string *)field);
  CodeWriter::SetValue(&this->code_,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"CONSTANT",&local_1a9);
  SwiftConstant_abi_cxx11_((string *)local_1d0,this,field);
  CodeWriter::SetValue(&this->code_,&local_1a8,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  bVar1 = FieldDef::IsOptional(field);
  local_1139 = false;
  if (bVar1) {
    local_1139 = IsScalar((field->value).type.base_type);
  }
  def_Val.field_2._M_local_buf[0xf] = local_1139;
  pcVar2 = "{{CONSTANT}}";
  if (local_1139 != false) {
    pcVar2 = "nil";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,pcVar2,(allocator<char> *)(optional.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(optional.field_2._M_local_buf + 0xf));
  pcVar2 = "";
  if ((def_Val.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar2 = "?";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_220,pcVar2,(allocator<char> *)(const_string.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(const_string.field_2._M_local_buf + 0xf));
  std::operator+(&local_268,"return o == 0 ? ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 &local_268," : ");
  std::__cxx11::string::~string((string *)&local_268);
  GenComment(this,&(field->super_Definition).doc_comment);
  bVar1 = IsScalar((field->value).type.base_type);
  if (((!bVar1) || (bVar1 = IsEnum(&(field->value).type), bVar1)) ||
     (bVar1 = IsBool((field->value).type.base_type), bVar1)) {
    bVar1 = IsBool((field->value).type.base_type);
    if (bVar1) {
      bVar1 = FieldDef::IsOptional(field);
      local_42a = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_42a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_428,"nil",&local_429);
      }
      else {
        SwiftConstant_abi_cxx11_((string *)local_428,this,field);
      }
      if ((local_42a & 1) != 0) {
        std::allocator<char>::~allocator(&local_429);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"CONSTANT",&local_451)
      ;
      CodeWriter::SetValue(&this->code_,&local_450,(string *)local_428);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"VALUETYPE",&local_479);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Bool",&local_4a1);
      CodeWriter::SetValue(&this->code_,&local_478,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      GenReaderMainBody(&local_4e8,this,(string *)local_220);
      std::operator+(&local_4c8,&local_4e8,"\\");
      CodeWriter::operator+=(&this->code_,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      GenOffset_abi_cxx11_(&local_568,this);
      std::operator+(&local_548,&local_568,"return o == 0 ? {{CONSTANT}} : ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"VALUETYPE",&local_5a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"o",&local_5d1);
      GenReader(&local_588,this,&local_5a8,&local_5d0);
      std::operator+(&local_528,&local_548,&local_588);
      std::operator+(&local_508,&local_528," }");
      CodeWriter::operator+=(&this->code_,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator(&local_5a9);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"o",&local_619);
        GenOffset_abi_cxx11_((string *)((long)&default_value_1.field_2 + 8),this);
        GenMutate(&local_5f8,this,&local_618,(string *)((long)&default_value_1.field_2 + 8),false);
        CodeWriter::operator+=(&this->code_,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)(default_value_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator(&local_619);
      }
      default_value.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_428);
    }
    else {
      bVar1 = IsEnum(&(field->value).type);
      if (bVar1) {
        bVar1 = FieldDef::IsOptional(field);
        local_662 = 0;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_662 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_660,"nil",&local_661);
        }
        else {
          GenEnumDefaultValue_abi_cxx11_((string *)local_660,this,field);
        }
        if ((local_662 & 1) != 0) {
          std::allocator<char>::~allocator(&local_661);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,"BASEVALUE",&local_689);
        GenTypeBasic_abi_cxx11_(&local_6b0,this,&(field->value).type,false);
        CodeWriter::SetValue(&this->code_,&local_688,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        GenReaderMainBody(&local_6f0,this,(string *)local_220);
        std::operator+(&local_6d0,&local_6f0,"\\");
        CodeWriter::operator+=(&this->code_,&local_6d0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::__cxx11::string::~string((string *)&local_6f0);
        GenOffset_abi_cxx11_(&local_7f0,this);
        std::operator+(&local_7d0,&local_7f0,"return o == 0 ? ");
        std::operator+(&local_7b0,&local_7d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_660);
        std::operator+(&local_790,&local_7b0," : ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"o",&local_831);
        GenEnumConstructor(&local_810,this,&local_830);
        std::operator+(&local_770,&local_790,&local_810);
        std::operator+(&local_750,&local_770,"?? ");
        std::operator+(&local_730,&local_750,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_660);
        std::operator+(&local_710,&local_730," }");
        CodeWriter::operator+=(&this->code_,&local_710);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)&local_730);
        std::__cxx11::string::~string((string *)&local_750);
        std::__cxx11::string::~string((string *)&local_770);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_830);
        std::allocator<char>::~allocator(&local_831);
        std::__cxx11::string::~string((string *)&local_790);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&local_7f0);
        if ((((((this->super_BaseGenerator).parser_)->opts).mutable_buffer & 1U) != 0) &&
           (bVar1 = IsUnion(&(field->value).type), !bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"o",&local_879);
          GenOffset_abi_cxx11_((string *)((long)&is_required.field_2 + 8),this);
          GenMutate(&local_858,this,&local_878,(string *)((long)&is_required.field_2 + 8),true);
          CodeWriter::operator+=(&this->code_,&local_858);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string((string *)(is_required.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_878);
          std::allocator<char>::~allocator(&local_879);
        }
        default_value.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_660);
      }
      else {
        bVar1 = FieldDef::IsRequired(field);
        if (bVar1) {
          local_1208 = "!";
        }
        else {
          local_1208 = "?";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_8c0,local_1208,
                   (allocator<char> *)(required_reader.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(required_reader.field_2._M_local_buf + 0xf));
        local_8ea = 0;
        bVar1 = FieldDef::IsRequired(field);
        if (bVar1) {
          std::allocator<char>::allocator();
          local_8ea = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_8e8,"return ",&local_8e9);
        }
        else {
          std::__cxx11::string::string((string *)local_8e8,(string *)local_248);
        }
        if ((local_8ea & 1) != 0) {
          std::allocator<char>::~allocator(&local_8e9);
        }
        bVar1 = IsStruct(&(field->value).type);
        if ((bVar1) && ((((field->value).type.struct_def)->fixed & 1U) != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_910,"VALUETYPE",&local_911);
          GenType_abi_cxx11_(&local_938,this,&(field->value).type,false);
          CodeWriter::SetValue(&this->code_,&local_910,&local_938);
          std::__cxx11::string::~string((string *)&local_938);
          std::__cxx11::string::~string((string *)&local_910);
          std::allocator<char>::~allocator(&local_911);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"CONSTANT",&local_959);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"nil",&local_981);
          CodeWriter::SetValue(&this->code_,&local_958,&local_980);
          std::__cxx11::string::~string((string *)&local_980);
          std::allocator<char>::~allocator(&local_981);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator(&local_959);
          GenReaderMainBody(&local_a08,this,(string *)local_8c0);
          GenOffset_abi_cxx11_(&local_a28,this);
          std::operator+(&local_9e8,&local_a08,&local_a28);
          std::operator+(&local_9c8,&local_9e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8e8);
          std::operator+(&local_9a8,&local_9c8,
                         "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }");
          CodeWriter::operator+=(&this->code_,&local_9a8);
          std::__cxx11::string::~string((string *)&local_9a8);
          std::__cxx11::string::~string((string *)&local_9c8);
          std::__cxx11::string::~string((string *)&local_9e8);
          std::__cxx11::string::~string((string *)&local_a28);
          std::__cxx11::string::~string((string *)&local_a08);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a48,"FIELDVAR",&local_a49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a90,"mutable",&local_a91);
          Namer::Variable(&local_a70,&(this->namer_).super_Namer,&local_a90,(string *)local_58);
          CodeWriter::SetValue(&this->code_,&local_a48,&local_a70);
          std::__cxx11::string::~string((string *)&local_a70);
          std::__cxx11::string::~string((string *)&local_a90);
          std::allocator<char>::~allocator(&local_a91);
          std::__cxx11::string::~string((string *)&local_a48);
          std::allocator<char>::~allocator(&local_a49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ab8,"VALUETYPE",&local_ab9);
          GenType_abi_cxx11_(&local_b00,this,&(field->value).type,false);
          Mutable_abi_cxx11_(&local_b20,this);
          std::operator+(&local_ae0,&local_b00,&local_b20);
          CodeWriter::SetValue(&this->code_,&local_ab8,&local_ae0);
          std::__cxx11::string::~string((string *)&local_ae0);
          std::__cxx11::string::~string((string *)&local_b20);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_ab8);
          std::allocator<char>::~allocator(&local_ab9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b40,"CONSTANT",&local_b41);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"nil",&local_b69);
          CodeWriter::SetValue(&this->code_,&local_b40,&local_b68);
          std::__cxx11::string::~string((string *)&local_b68);
          std::allocator<char>::~allocator(&local_b69);
          std::__cxx11::string::~string((string *)&local_b40);
          std::allocator<char>::~allocator(&local_b41);
          GenReaderMainBody(&local_bf0,this,(string *)local_8c0);
          GenOffset_abi_cxx11_(&local_c10,this);
          std::operator+(&local_bd0,&local_bf0,&local_c10);
          std::operator+(&local_bb0,&local_bd0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c50,"o + {{ACCESS}}.position",&local_c51);
          GenConstructor(&local_c30,this,&local_c50);
          std::operator+(&local_b90,&local_bb0,&local_c30);
          CodeWriter::operator+=(&this->code_,&local_b90);
          std::__cxx11::string::~string((string *)&local_b90);
          std::__cxx11::string::~string((string *)&local_c30);
          std::__cxx11::string::~string((string *)&local_c50);
          std::allocator<char>::~allocator(&local_c51);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_bd0);
          std::__cxx11::string::~string((string *)&local_c10);
          std::__cxx11::string::~string((string *)&local_bf0);
          default_value.field_2._12_4_ = 1;
        }
        else {
          switch((field->value).type.base_type) {
          case BASE_TYPE_STRING:
            SwiftConstant_abi_cxx11_(&local_e58,this,field);
            std::operator+(&local_e38,"\"",&local_e58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e18,&local_e38,"\"");
            std::__cxx11::string::~string((string *)&local_e38);
            std::__cxx11::string::~string((string *)&local_e58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e78,"VALUETYPE",&local_e79);
            GenType_abi_cxx11_(&local_ea0,this,&(field->value).type,false);
            CodeWriter::SetValue(&this->code_,&local_e78,&local_ea0);
            std::__cxx11::string::~string((string *)&local_ea0);
            std::__cxx11::string::~string((string *)&local_e78);
            std::allocator<char>::~allocator(&local_e79);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ec0,"CONSTANT",&local_ec1);
            local_eea = 0;
            bVar1 = FieldDef::IsDefault(field);
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_ee8,(string *)local_e18);
            }
            else {
              std::allocator<char>::allocator();
              local_eea = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_ee8,"nil",&local_ee9);
            }
            CodeWriter::SetValue(&this->code_,&local_ec0,&local_ee8);
            std::__cxx11::string::~string((string *)&local_ee8);
            if ((local_eea & 1) != 0) {
              std::allocator<char>::~allocator(&local_ee9);
            }
            std::__cxx11::string::~string((string *)&local_ec0);
            std::allocator<char>::~allocator(&local_ec1);
            GenReaderMainBody(&local_f70,this,(string *)local_8c0);
            GenOffset_abi_cxx11_(&local_f90,this);
            std::operator+(&local_f50,&local_f70,&local_f90);
            std::operator+(&local_f30,&local_f50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8e8);
            std::operator+(&local_f10,&local_f30,"{{ACCESS}}.string(at: o) }");
            CodeWriter::operator+=(&this->code_,&local_f10);
            std::__cxx11::string::~string((string *)&local_f10);
            std::__cxx11::string::~string((string *)&local_f30);
            std::__cxx11::string::~string((string *)&local_f50);
            std::__cxx11::string::~string((string *)&local_f90);
            std::__cxx11::string::~string((string *)&local_f70);
            std::operator+(&local_fd0,"{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8c0);
            std::operator+(&local_fb0,&local_fd0,
                           " { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }");
            CodeWriter::operator+=(&this->code_,&local_fb0);
            std::__cxx11::string::~string((string *)&local_fb0);
            std::__cxx11::string::~string((string *)&local_fd0);
            default_value.field_2._12_4_ = 2;
            std::__cxx11::string::~string((string *)local_e18);
            break;
          case BASE_TYPE_STRUCT:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c78,"VALUETYPE",&local_c79);
            GenType_abi_cxx11_(&local_ca0,this,&(field->value).type,false);
            CodeWriter::SetValue(&this->code_,&local_c78,&local_ca0);
            std::__cxx11::string::~string((string *)&local_ca0);
            std::__cxx11::string::~string((string *)&local_c78);
            std::allocator<char>::~allocator(&local_c79);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_cc0,"CONSTANT",&local_cc1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ce8,"nil",&local_ce9);
            CodeWriter::SetValue(&this->code_,&local_cc0,&local_ce8);
            std::__cxx11::string::~string((string *)&local_ce8);
            std::allocator<char>::~allocator(&local_ce9);
            std::__cxx11::string::~string((string *)&local_cc0);
            std::allocator<char>::~allocator(&local_cc1);
            GenReaderMainBody(&local_d70,this,(string *)local_8c0);
            GenOffset_abi_cxx11_(&local_d90,this);
            std::operator+(&local_d50,&local_d70,&local_d90);
            std::operator+(&local_d30,&local_d50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8e8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_df0,"o + {{ACCESS}}.position",
                       (allocator<char> *)(default_string.field_2._M_local_buf + 0xf));
            anon_unknown_1::GenIndirect(&local_dd0,&local_df0);
            GenConstructor(&local_db0,this,&local_dd0);
            std::operator+(&local_d10,&local_d30,&local_db0);
            CodeWriter::operator+=(&this->code_,&local_d10);
            std::__cxx11::string::~string((string *)&local_d10);
            std::__cxx11::string::~string((string *)&local_db0);
            std::__cxx11::string::~string((string *)&local_dd0);
            std::__cxx11::string::~string((string *)&local_df0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(default_string.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string((string *)&local_d30);
            std::__cxx11::string::~string((string *)&local_d50);
            std::__cxx11::string::~string((string *)&local_d90);
            std::__cxx11::string::~string((string *)&local_d70);
            break;
          case BASE_TYPE_UNION:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ff0,"CONSTANT",&local_ff1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1018,"nil",&local_1019);
            CodeWriter::SetValue(&this->code_,&local_ff0,&local_1018);
            std::__cxx11::string::~string((string *)&local_1018);
            std::allocator<char>::~allocator(&local_1019);
            std::__cxx11::string::~string((string *)&local_ff0);
            std::allocator<char>::~allocator(&local_ff1);
            std::operator+(&local_10c0,
                           "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(type: T.Type) -> T"
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_8c0);
            std::operator+(&local_10a0,&local_10c0," { ");
            GenOffset_abi_cxx11_(&local_10e0,this);
            std::operator+(&local_1080,&local_10a0,&local_10e0);
            std::operator+(&local_1060,&local_1080,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8e8);
            std::operator+(&local_1040,&local_1060,"{{ACCESS}}.union(o) }");
            CodeWriter::operator+=(&this->code_,&local_1040);
            std::__cxx11::string::~string((string *)&local_1040);
            std::__cxx11::string::~string((string *)&local_1060);
            std::__cxx11::string::~string((string *)&local_1080);
            std::__cxx11::string::~string((string *)&local_10e0);
            std::__cxx11::string::~string((string *)&local_10a0);
            std::__cxx11::string::~string((string *)&local_10c0);
            break;
          case BASE_TYPE_ARRAY:
          case BASE_TYPE_VECTOR:
            GenTableReaderVectorFields(this,field);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                          ,0x318,
                          "void flatbuffers::swift::SwiftGenerator::GenTableReaderFields(const FieldDef &)"
                         );
          }
          default_value.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_8e8);
        std::__cxx11::string::~string((string *)local_8c0);
      }
    }
  }
  else {
    GenReaderMainBody(&local_308,this,(string *)local_220);
    GenOffset_abi_cxx11_(&local_328,this);
    std::operator+(&local_2e8,&local_308,&local_328);
    std::operator+(&local_2c8,&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"VALUETYPE",&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"o",&local_391);
    GenReader(&local_348,this,&local_368,&local_390);
    std::operator+(&local_2a8,&local_2c8,&local_348);
    std::operator+(&local_288,&local_2a8," }");
    CodeWriter::operator+=(&this->code_,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"o",&local_3d9);
      GenOffset_abi_cxx11_(&local_400,this);
      GenMutate(&local_3b8,this,&local_3d8,&local_400,false);
      CodeWriter::operator+=(&this->code_,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
    }
    default_value.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenTableReaderFields(const FieldDef &field) {
    const auto offset = NumToString(field.value.offset);
    const auto field_field = namer_.Field(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("FIELDMETHOD", namer_.Method(field));
    code_.SetValue("VALUETYPE", type);
    code_.SetValue("OFFSET", namer_.Constant(field.name));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    bool opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    std::string def_Val = opt_scalar ? "nil" : "{{CONSTANT}}";
    std::string optional = opt_scalar ? "?" : "";
    const auto const_string = "return o == 0 ? " + def_Val + " : ";
    GenComment(field.doc_comment);
    if (IsScalar(field.value.type.base_type) && !IsEnum(field.value.type) &&
        !IsBool(field.value.type.base_type)) {
      code_ += GenReaderMainBody(optional) + GenOffset() + const_string +
               GenReader("VALUETYPE", "o") + " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value =
          field.IsOptional() ? "nil" : SwiftConstant(field);
      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", "Bool");
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() +
               "return o == 0 ? {{CONSTANT}} : " + GenReader("VALUETYPE", "o") +
               " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsEnum(field.value.type)) {
      const auto default_value =
          field.IsOptional() ? "nil" : GenEnumDefaultValue(field);
      code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() + "return o == 0 ? " + default_value + " : " +
               GenEnumConstructor("o") + "?? " + default_value + " }";
      if (parser_.opts.mutable_buffer && !IsUnion(field.value.type))
        code_ += GenMutate("o", GenOffset(), true);
      return;
    }

    const std::string is_required = field.IsRequired() ? "!" : "?";
    const auto required_reader = field.IsRequired() ? "return " : const_string;

    if (IsStruct(field.value.type) && field.value.type.struct_def->fixed) {
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }";
      code_.SetValue("FIELDVAR", namer_.Variable("mutable", field_field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               GenConstructor("o + {{ACCESS}}.position");
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader +
                 GenConstructor(GenIndirect("o + {{ACCESS}}.position"));
        break;

      case BASE_TYPE_STRING: {
        const auto default_string = "\"" + SwiftConstant(field) + "\"";
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", field.IsDefault() ? default_string : "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader + "{{ACCESS}}.string(at: o) }";
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]" +
                 is_required +
                 " { return "
                 "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }";
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: GenTableReaderVectorFields(field); break;
      case BASE_TYPE_UNION:
        code_.SetValue("CONSTANT", "nil");
        code_ +=
            "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: "
            "FlatbuffersInitializable>(type: "
            "T.Type) -> T" +
            is_required + " { " + GenOffset() + required_reader +
            "{{ACCESS}}.union(o) }";
        break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }